

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

double getDistance(Mesh *mesh,VectorXd *params,EdgeHandle *e,VertexHandle *p)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  long lVar5;
  VectorT<double,2> *_rhs;
  float fVar6;
  double dVar7;
  type tVar8;
  type tVar9;
  type tVar10;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  VectorT<double,_2> local_38;
  
  lVar2 = *(long *)&(mesh->super_Mesh).
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                    .super_PolyConnectivity.field_0xe0;
  lVar5 = ((long)((ulong)(uint)(e->super_BaseHandle).idx_ << 0x21) >> 0x21) * 0x20;
  pdVar3 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  pdVar1 = pdVar3 + (long)*(int *)(lVar2 + 4 + lVar5) * 2;
  local_38.values_._M_elems[0] = *pdVar1;
  local_38.values_._M_elems[1] = pdVar1[1];
  pdVar3 = pdVar3 + (long)*(int *)(lVar2 + 0x14 + lVar5) * 2;
  local_48 = *pdVar3;
  dStack_40 = pdVar3[1];
  tVar8 = OpenMesh::VectorT<double,2>::operator-((VectorT<double,2> *)&local_48,&local_38);
  dVar7 = tVar8.values_._M_elems[1];
  dVar4 = tVar8.values_._M_elems[0];
  pdVar1 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           + (long)(p->super_BaseHandle).idx_ * 2;
  local_58 = *pdVar1;
  dStack_50 = pdVar1[1];
  tVar8 = OpenMesh::VectorT<double,2>::operator-((VectorT<double,2> *)&local_58,&local_38);
  tVar9 = OpenMesh::VectorT<double,2>::operator-((VectorT<double,2> *)&local_58,&local_38);
  tVar10 = OpenMesh::VectorT<double,2>::operator-((VectorT<double,2> *)&local_58,&local_38);
  fVar6 = (float)((tVar10.values_._M_elems[1] * tVar9.values_._M_elems[1] +
                  tVar10.values_._M_elems[0] * tVar9.values_._M_elems[0]) -
                 (tVar8.values_._M_elems[1] * dVar7 + tVar8.values_._M_elems[0] * dVar4) /
                 SQRT(dVar7 * dVar7 + dVar4 * dVar4));
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  tVar8 = OpenMesh::VectorT<double,2>::operator-
                    ((VectorT<double,2> *)&local_58,(VectorT<double,_2> *)&local_48);
  tVar9 = OpenMesh::VectorT<double,2>::operator-
                    ((VectorT<double,2> *)&local_38,(VectorT<double,_2> *)&local_48);
  _rhs = (VectorT<double,2> *)&local_48;
  if (0.0 <= tVar9.values_._M_elems[1] * tVar8.values_._M_elems[1] +
             tVar9.values_._M_elems[0] * tVar8.values_._M_elems[0]) {
    tVar8 = OpenMesh::VectorT<double,2>::operator-((VectorT<double,2> *)&local_58,&local_38);
    tVar9 = OpenMesh::VectorT<double,2>::operator-((VectorT<double,2> *)&local_48,&local_38);
    _rhs = (VectorT<double,2> *)&local_38;
    if (0.0 <= tVar9.values_._M_elems[1] * tVar8.values_._M_elems[1] +
               tVar9.values_._M_elems[0] * tVar8.values_._M_elems[0]) {
      return (double)fVar6;
    }
  }
  tVar8 = OpenMesh::VectorT<double,2>::operator-
                    ((VectorT<double,2> *)&local_58,(VectorT<double,_2> *)_rhs);
  return SQRT(tVar8.values_._M_elems[1] * tVar8.values_._M_elems[1] +
              tVar8.values_._M_elems[0] * tVar8.values_._M_elems[0]);
}

Assistant:

double getDistance(const Mesh& mesh, const Eigen::VectorXd& params, const OpenMesh::EdgeHandle& e, const OpenMesh::VertexHandle& p) {
    int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
    int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
    OpenMesh::Vec2d pst(params[2 * st], params[2 * st + 1]); 
    OpenMesh::Vec2d pend(params[2 * end], params[2 * end + 1]); 
    OpenMesh::Vec2d edge = pend - pst;

    OpenMesh::Vec2d point(params[p.idx() * 2], params[p.idx() * 2 + 1]);
    double projected = OpenMesh::dot(point - pst, edge) / edge.norm();
    double dis = sqrtf(OpenMesh::dot(point - pst, point - pst) - projected);

    if (OpenMesh::dot(point - pend, pst - pend) < 0.0) 
        dis = (point - pend).norm();
    else if (OpenMesh::dot(point - pst, pend - pst) < 0.0) 
        dis = (point - pst).norm();

    return dis;
}